

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::ReserveDestination::GetReservedDestination(ReserveDestination *this,bool internal)

{
  byte bVar1;
  bool bVar2;
  ScriptPubKeyMan *pSVar3;
  byte in_DL;
  long in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *op_address;
  int64_t index;
  CKeyPool keypool;
  CKeyPool *in_stack_fffffffffffffe58;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffe60;
  T *obj;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  OutputType *in_stack_fffffffffffffe78;
  CWallet *pCVar4;
  ConstevalStringLiteral in_stack_fffffffffffffea8;
  char *args;
  undefined7 in_stack_fffffffffffffeb8;
  undefined8 local_130;
  T local_128;
  undefined1 local_d8 [73];
  byte local_8f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  pCVar4 = in_RDI;
  pSVar3 = CWallet::GetScriptPubKeyMan
                     (in_RDI,in_stack_fffffffffffffe78,
                      SUB81((ulong)in_stack_fffffffffffffe70 >> 0x38,0));
  *(ScriptPubKeyMan **)(in_RSI + 8) = pSVar3;
  if (*(long *)(in_RSI + 8) == 0) {
    args = "Error: No %s addresses available.";
    _(in_stack_fffffffffffffea8);
    FormatOutputType_abi_cxx11_((OutputType)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)CONCAT17(bVar1,in_stack_fffffffffffffeb8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    util::
    Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::Result(in_stack_fffffffffffffe68,(Error *)in_stack_fffffffffffffe60);
    util::Error::~Error((Error *)in_stack_fffffffffffffe58);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffe58);
  }
  else {
    if (*(long *)(in_RSI + 0x18) == -1) {
      CKeyPool::CKeyPool(in_stack_fffffffffffffe58);
      (**(code **)(**(long **)(in_RSI + 8) + 0x30))
                (pCVar4,*(long **)(in_RSI + 8),*(undefined4 *)(in_RSI + 0x10),bVar1 & 1,&local_130,
                 local_d8);
      bVar2 = util::Result::operator_cast_to_bool
                        ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                          *)in_stack_fffffffffffffe58);
      if (!bVar2) goto LAB_001b7be5;
      *(undefined8 *)(in_RSI + 0x18) = local_130;
      in_stack_fffffffffffffe68 =
           (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            *)util::
              Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                           *)in_stack_fffffffffffffe58);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      *(byte *)(in_RSI + 0x70) = local_8f & 1;
      util::
      Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
      ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                 *)in_stack_fffffffffffffe58);
    }
    obj = &local_128;
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)in_stack_fffffffffffffe58,
              (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)0x1b7ba4);
    util::
    Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::Result(in_stack_fffffffffffffe68,obj);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffffe58);
  }
LAB_001b7be5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> ReserveDestination::GetReservedDestination(bool internal)
{
    m_spk_man = pwallet->GetScriptPubKeyMan(type, internal);
    if (!m_spk_man) {
        return util::Error{strprintf(_("Error: No %s addresses available."), FormatOutputType(type))};
    }

    if (nIndex == -1) {
        CKeyPool keypool;
        int64_t index;
        auto op_address = m_spk_man->GetReservedDestination(type, internal, index, keypool);
        if (!op_address) return op_address;
        nIndex = index;
        address = *op_address;
        fInternal = keypool.fInternal;
    }
    return address;
}